

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

bool __thiscall
ddd::DaTrie<false,_false,_false>::delete_key(DaTrie<false,_false,_false> *this,Query *query)

{
  uint node_pos;
  pointer pBVar1;
  Bc BVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  DaTrie<false,_false,_false> local_a8;
  
  bVar3 = search_key(this,query);
  if (bVar3) {
    node_pos = query->node_pos_;
    uVar5 = (ulong)node_pos;
    if (uVar5 == 0) {
      local_a8.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.blocks_.super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.blocks_.super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.blocks_.super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_a8.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_a8.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_a8.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.head_pos_ = 0xffffffff;
      local_a8.bc_emps_ = 0;
      local_a8.tail_emps_ = 0;
      swap(&local_a8,this);
      ~DaTrie(&local_a8);
    }
    else {
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      BVar2 = pBVar1[uVar5];
      if (((int)BVar2._0_4_ < 0) &&
         ((*(uint *)(&pBVar1->field_0x0 + ((ulong)BVar2 >> 0x1d & 0x3fffffff8)) & 0x7fffffff) ==
          node_pos)) {
        uVar6 = BVar2._4_4_;
      }
      else {
        sVar4 = strlen((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + (BVar2._0_4_ & 0x7fffffff));
        this->tail_emps_ = (int)sVar4 + this->tail_emps_ + 5;
        uVar6 = *(uint *)&pBVar1[uVar5].field_0x4;
      }
      unfix_(this,node_pos,&this->blocks_);
      query->node_pos_ = uVar6 & 0x7fffffff;
      query->is_finished_ = false;
      query->pos_ = query->pos_ - 1;
      change_branch_(this,query);
    }
  }
  return bVar3;
}

Assistant:

bool delete_key(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    if (!search_key(query)) {
      return false;
    }

    if (query.node_pos() == ROOT_POS) {
      DaTrie().swap(*this);
      return true;
    }

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    if (!is_terminal_(query.node_pos())) {
      auto tail_pos = bc_[query.node_pos()].value();
      tail_emps_ += utils::length(tail_.data() + tail_pos) + sizeof(uint32_t);
    }

    auto parent_pos = bc_[query.node_pos()].check();
    unfix_(query.node_pos(), blocks_);
    query.prev(parent_pos);

    change_branch_(query);
    return true;
  }